

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderPrimitiveCounter::GeometryShaderPrimitiveCounter
          (GeometryShaderPrimitiveCounter *this,Context *context,ExtParameters *extParams,char *name
          ,char *description,DataPrimitiveIDInCounter *testConfiguration)

{
  pointer pcVar1;
  GLuint GVar2;
  
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShaderPrimitiveCounter_0214c930;
  (this->m_testConfiguration).m_drawMode = testConfiguration->m_drawMode;
  (this->m_testConfiguration).m_emitVertexCodeForGeometryShader._M_dataplus._M_p =
       (pointer)&(this->m_testConfiguration).m_emitVertexCodeForGeometryShader.field_2;
  pcVar1 = (testConfiguration->m_emitVertexCodeForGeometryShader)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_testConfiguration).m_emitVertexCodeForGeometryShader,pcVar1,
             pcVar1 + (testConfiguration->m_emitVertexCodeForGeometryShader)._M_string_length);
  (this->m_testConfiguration).m_feedbackMode = testConfiguration->m_feedbackMode;
  (this->m_testConfiguration).m_layoutIn._M_dataplus._M_p =
       (pointer)&(this->m_testConfiguration).m_layoutIn.field_2;
  pcVar1 = (testConfiguration->m_layoutIn)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_testConfiguration).m_layoutIn,pcVar1,
             pcVar1 + (testConfiguration->m_layoutIn)._M_string_length);
  (this->m_testConfiguration).m_layoutOut._M_dataplus._M_p =
       (pointer)&(this->m_testConfiguration).m_layoutOut.field_2;
  pcVar1 = (testConfiguration->m_layoutOut)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_testConfiguration).m_layoutOut,pcVar1,
             pcVar1 + (testConfiguration->m_layoutOut)._M_string_length);
  (this->m_testConfiguration).m_numberOfDrawnPrimitives =
       testConfiguration->m_numberOfDrawnPrimitives;
  GVar2 = testConfiguration->m_numberOfVerticesPerOneInputPrimitive;
  (this->m_testConfiguration).m_numberOfVerticesPerOneOutputPrimitive =
       testConfiguration->m_numberOfVerticesPerOneOutputPrimitive;
  (this->m_testConfiguration).m_numberOfVerticesPerOneInputPrimitive = GVar2;
  this->m_nrVaryings = 0;
  this->m_sizeOfDataArray = 0;
  this->m_sizeOfFeedbackBuffer = 0;
  this->m_n_components = 4;
  this->m_maxGeometryOutputVertices = 0;
  this->m_fragment_shader_id = 0;
  this->m_geometry_shader_id = 0;
  this->m_vertex_shader_id = 0;
  this->m_program_id = 0;
  this->m_tbo = 0;
  this->m_vao = 0;
  this->m_vbo = 0;
  return;
}

Assistant:

GeometryShaderPrimitiveCounter::GeometryShaderPrimitiveCounter(Context& context, const ExtParameters& extParams,
															   const char* name, const char* description,
															   const DataPrimitiveIDInCounter& testConfiguration)
	: TestCaseBase(context, extParams, name, description)
	, m_testConfiguration(testConfiguration)
	, m_nrVaryings(0)
	, m_sizeOfDataArray(0)
	, m_sizeOfFeedbackBuffer(0)
	, m_n_components(4)
	, m_maxGeometryOutputVertices(0)
	, m_fragment_shader_id(0)
	, m_geometry_shader_id(0)
	, m_vertex_shader_id(0)
	, m_program_id(0)
	, m_tbo(0)
	, m_vao(0)
	, m_vbo(0)
{
	/* Left blank on purpose */
}